

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

BGZF * bgzf_dopen(int fd,char *mode)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  hFILE *phVar4;
  BGZF *pBVar5;
  int *piVar6;
  
  uVar2 = compressBound(0xff00);
  if (0xffff < uVar2) {
    __assert_fail("compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                  ,0xc2,"BGZF *bgzf_dopen(int, const char *)");
  }
  pcVar3 = strchr(mode,0x72);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strchr(mode,0x77);
    if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(mode,0x61), pcVar3 == (char *)0x0)) {
      piVar6 = __errno_location();
      *piVar6 = 0x16;
      return (BGZF *)0x0;
    }
    phVar4 = hdopen(fd,mode);
    if (phVar4 == (hFILE *)0x0) {
      return (BGZF *)0x0;
    }
    pBVar5 = bgzf_write_init(mode);
    pBVar5->fp = phVar4;
    goto LAB_00137078;
  }
  phVar4 = hdopen(fd,mode);
  if (phVar4 == (hFILE *)0x0) {
LAB_00137067:
    pBVar5 = (BGZF *)0x0;
    bVar1 = false;
  }
  else {
    pBVar5 = bgzf_read_init(phVar4);
    if (pBVar5 == (BGZF *)0x0) {
      hclose_abruptly(phVar4);
      goto LAB_00137067;
    }
    pBVar5->fp = phVar4;
    bVar1 = true;
  }
  if (!bVar1) {
    return (BGZF *)0x0;
  }
LAB_00137078:
  pBVar5->field_0x2 = pBVar5->field_0x2 & 0xf3;
  return pBVar5;
}

Assistant:

BGZF *bgzf_dopen(int fd, const char *mode)
{
    BGZF *fp = 0;
    assert(compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE);
    if (strchr(mode, 'r')) {
        hFILE *fpr;
        if ((fpr = hdopen(fd, mode)) == 0) return 0;
        fp = bgzf_read_init(fpr);
        if (fp == 0) { hclose_abruptly(fpr); return NULL; } // FIXME this closes fd
        fp->fp = fpr;
    } else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        hFILE *fpw;
        if ((fpw = hdopen(fd, mode)) == 0) return 0;
        fp = bgzf_write_init(mode);
        fp->fp = fpw;
    }
    else { errno = EINVAL; return 0; }

    fp->is_be = ed_is_big();
    return fp;
}